

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void __thiscall re2::Regexp::ParseState::DoCollapse(ParseState *this,RegexpOp op)

{
  undefined1 auVar1 [16];
  bool bVar2;
  RegexpOp RVar3;
  ulong uVar4;
  Regexp **sub_00;
  Regexp **ppRVar5;
  Regexp *pRVar6;
  byte local_5a;
  byte local_59;
  Regexp *re;
  int k;
  Regexp **sub_subs;
  int i;
  Regexp **subs;
  Regexp *sub;
  Regexp *next;
  int n;
  RegexpOp op_local;
  ParseState *this_local;
  
  next._0_4_ = 0;
  sub = (Regexp *)0x0;
  subs = (Regexp **)this->stacktop_;
  while( true ) {
    local_59 = 0;
    if (subs != (Regexp **)0x0) {
      RVar3 = Regexp::op((Regexp *)subs);
      bVar2 = IsMarker(this,RVar3);
      local_59 = bVar2 ^ 0xff;
    }
    if ((local_59 & 1) == 0) break;
    sub = subs[2];
    if (*(byte *)subs == op) {
      next._0_4_ = (uint)*(ushort *)((long)subs + 6) + (int)next;
      subs = (Regexp **)sub;
    }
    else {
      next._0_4_ = (int)next + 1;
      subs = (Regexp **)sub;
    }
  }
  if ((this->stacktop_ == (Regexp *)0x0) || (this->stacktop_->down_ != sub)) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(int)next;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    sub_00 = (Regexp **)operator_new__(uVar4);
    sub = (Regexp *)0x0;
    sub_subs._4_4_ = (int)next;
    subs = (Regexp **)this->stacktop_;
    while( true ) {
      local_5a = 0;
      if (subs != (Regexp **)0x0) {
        RVar3 = Regexp::op((Regexp *)subs);
        bVar2 = IsMarker(this,RVar3);
        local_5a = bVar2 ^ 0xff;
      }
      if ((local_5a & 1) == 0) break;
      sub = subs[2];
      if (*(byte *)subs == op) {
        ppRVar5 = Regexp::sub((Regexp *)subs);
        re._4_4_ = (uint)*(ushort *)((long)subs + 6);
        while (re._4_4_ = re._4_4_ - 1, -1 < (int)re._4_4_) {
          pRVar6 = Incref(ppRVar5[(int)re._4_4_]);
          sub_subs._4_4_ = sub_subs._4_4_ + -1;
          sub_00[sub_subs._4_4_] = pRVar6;
        }
        Decref((Regexp *)subs);
        subs = (Regexp **)sub;
      }
      else {
        pRVar6 = FinishRegexp(this,(Regexp *)subs);
        sub_subs._4_4_ = sub_subs._4_4_ + -1;
        sub_00[sub_subs._4_4_] = pRVar6;
        subs = (Regexp **)sub;
      }
    }
    pRVar6 = ConcatOrAlternate(op,sub_00,(int)next,this->flags_,true);
    if (sub_00 != (Regexp **)0x0) {
      operator_delete__(sub_00);
    }
    bVar2 = ComputeSimple(pRVar6);
    pRVar6->simple_ = bVar2;
    pRVar6->down_ = sub;
    this->stacktop_ = pRVar6;
  }
  return;
}

Assistant:

void Regexp::ParseState::DoCollapse(RegexpOp op) {
  // Scan backward to marker, counting children of composite.
  int n = 0;
  Regexp* next = NULL;
  Regexp* sub;
  for (sub = stacktop_; sub != NULL && !IsMarker(sub->op()); sub = next) {
    next = sub->down_;
    if (sub->op_ == op)
      n += sub->nsub_;
    else
      n++;
  }

  // If there's just one child, leave it alone.
  // (Concat of one thing is that one thing; alternate of one thing is same.)
  if (stacktop_ != NULL && stacktop_->down_ == next)
    return;

  // Construct op (alternation or concatenation), flattening op of op.
  Regexp** subs = new Regexp*[n];
  next = NULL;
  int i = n;
  for (sub = stacktop_; sub != NULL && !IsMarker(sub->op()); sub = next) {
    next = sub->down_;
    if (sub->op_ == op) {
      Regexp** sub_subs = sub->sub();
      for (int k = sub->nsub_ - 1; k >= 0; k--)
        subs[--i] = sub_subs[k]->Incref();
      sub->Decref();
    } else {
      subs[--i] = FinishRegexp(sub);
    }
  }

  Regexp* re = ConcatOrAlternate(op, subs, n, flags_, true);
  delete[] subs;
  re->simple_ = re->ComputeSimple();
  re->down_ = next;
  stacktop_ = re;
}